

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O0

unsigned_long __thiscall rc::Gen<unsigned_long>::operator*(Gen<unsigned_long> *this)

{
  ValueType pGVar1;
  unsigned_long uVar2;
  ValueType *ppGVar3;
  unsigned_long *puVar4;
  _func_Any_unsigned_long_ptr **in_RCX;
  undefined1 local_a0 [48];
  Gen<rc::detail::Any> local_70;
  Gen<rc::detail::Any> local_48;
  Any local_20;
  ValueType local_18;
  ValueType handler;
  Gen<unsigned_long> *this_local;
  
  handler = (ValueType)this;
  ppGVar3 = rc::detail::ImplicitParam<rc::gen::detail::param::CurrentHandler>::value();
  pGVar1 = *ppGVar3;
  local_18 = pGVar1;
  Gen((Gen<unsigned_long> *)(local_a0 + 8),this);
  local_a0._0_8_ = rc::detail::Any::of<unsigned_long>;
  rc::gen::map<unsigned_long,rc::detail::Any(*)(unsigned_long&&)>
            (&local_70,(gen *)(local_a0 + 8),(Gen<unsigned_long> *)local_a0,in_RCX);
  Gen<rc::detail::Any>::as(&local_48,&local_70,&this->m_name);
  (**pGVar1->_vptr_GenerationHandler)(&local_20,pGVar1,&local_48);
  puVar4 = rc::detail::Any::get<unsigned_long>(&local_20);
  uVar2 = *puVar4;
  rc::detail::Any::~Any(&local_20);
  Gen<rc::detail::Any>::~Gen(&local_48);
  Gen<rc::detail::Any>::~Gen(&local_70);
  ~Gen((Gen<unsigned_long> *)(local_a0 + 8));
  return uVar2;
}

Assistant:

T Gen<T>::operator*() const {
  using namespace detail;
  using rc::gen::detail::param::CurrentHandler;
  const auto handler = ImplicitParam<CurrentHandler>::value();
  return std::move(handler->onGenerate(gen::map(*this, &Any::of<T>).as(m_name))
                       .template get<T>());
}